

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O3

void H3_compute(picnic_instance_t *pp,uint8_t *hash,uint8_t *ch)

{
  byte bVar1;
  byte *in_RCX;
  uint uVar2;
  uint rate;
  byte *pbVar3;
  BitLength databitlen;
  hash_context ctx;
  BitSequence local_115;
  undefined4 local_114;
  Keccak_HashInstance local_110;
  
  local_114 = SUB84(hash,0);
  if ((short)pp != 0) {
    uVar2 = 0;
    pbVar3 = in_RCX + ((ulong)pp & 0xffff);
    databitlen = ((ulong)hash & 0xff) << 3;
    do {
      if ((uint)databitlen <= uVar2) {
        local_115 = '\x01';
        if ((char)local_114 == ' ') {
          rate = 0x540;
          uVar2 = 0x100;
        }
        else {
          rate = 0x440;
          uVar2 = 0x200;
        }
        Keccak_HashInitialize(&local_110,rate,uVar2,0,'\x1f');
        Keccak_HashUpdate(&local_110,&local_115,8);
        Keccak_HashUpdate(&local_110,ch,databitlen);
        uVar2 = 0;
        Keccak_HashFinal(&local_110,(BitSequence *)0x0);
        Keccak_HashSqueeze(&local_110,ch,databitlen);
      }
      bVar1 = ch[uVar2 >> 3] >> ((byte)(6 - ((byte)uVar2 & 7)) & 0x1f);
      if ((~bVar1 & 3) != 0) {
        *in_RCX = bVar1 & 3;
        in_RCX = in_RCX + 1;
      }
      uVar2 = uVar2 + 2;
    } while (in_RCX < pbVar3);
  }
  return;
}

Assistant:

static void H3_compute(const picnic_instance_t* pp, uint8_t* hash, uint8_t* ch) {
  const unsigned int digest_size      = pp->digest_size;
  const unsigned int digest_size_bits = digest_size << 3;

  // Pick bits from hash
  uint8_t* eof         = ch + pp->num_rounds;
  unsigned int bit_idx = 0;
  while (ch < eof) {
    if (bit_idx >= digest_size_bits) {
      hash_context ctx;
      hash_init_prefix(&ctx, digest_size, HASH_PREFIX_1);
      hash_update(&ctx, hash, digest_size);
      hash_final(&ctx);
      hash_squeeze(&ctx, hash, digest_size);
      hash_clear(&ctx);
      bit_idx = 0;
    }

    const uint8_t twobits = (hash[bit_idx >> 3] >> ((6 - (bit_idx & 0x7)))) & 0x3;
    if (twobits != 0x3) {
      *ch++ = twobits;
    }
    bit_idx += 2;
  }
}